

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 GenStateEmitExprCode(jx9_gen_state *pGen,jx9_expr_node *pNode,sxi32 iFlags)

{
  sxu32 sVar1;
  ProcNodeConstruct p_Var2;
  jx9_expr_op *pjVar3;
  SySet *pSVar4;
  undefined8 *puVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  sxi32 sVar9;
  char *pcVar10;
  sxu32 sVar11;
  long lVar12;
  jx9_vm *pVm;
  void *p3;
  sxi32 unaff_R15D;
  int iOp;
  sxu32 nJmpIdx;
  sxu32 nJmp;
  sxu32 nJz;
  sxu32 local_68;
  sxu32 local_54;
  sxu32 local_50;
  sxu32 local_4c;
  SyToken *local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  p_Var2 = pNode->xCode;
  if (p_Var2 != (ProcNodeConstruct)0x0) {
    local_48 = pGen->pIn;
    uStack_40 = *(undefined4 *)&pGen->pEnd;
    uStack_3c = *(undefined4 *)((long)&pGen->pEnd + 4);
    pGen->pIn = pNode->pStart;
    pGen->pEnd = pNode->pEnd;
    sVar9 = (*p_Var2)(pGen,iFlags);
    pGen->pIn = local_48;
    pGen->pEnd = (SyToken *)CONCAT44(uStack_3c,uStack_40);
    return sVar9;
  }
  pjVar3 = pNode->pOp;
  if (pjVar3 == (jx9_expr_op *)0x0) {
    jx9GenCompileError(pGen,1,pNode->pStart->nLine,
                       "Invalid expression node, JX9 is aborting compilation");
    return -10;
  }
  if (pjVar3->iOp == 0x26) {
    sVar9 = GenStateEmitExprCode(pGen,pNode->pCond,iFlags);
    if (sVar9 != 0) {
      return sVar9;
    }
    local_50 = 0;
    local_4c = 0;
    jx9VmEmitInstr(pGen->pVm,9,0,0,(void *)0x0,&local_4c);
    if ((pNode->pLeft != (jx9_expr_node *)0x0) &&
       (sVar9 = GenStateEmitExprCode(pGen,pNode->pLeft,iFlags), sVar9 != 0)) {
      return sVar9;
    }
    lVar12 = 0;
    jx9VmEmitInstr(pGen->pVm,8,0,0,(void *)0x0,&local_50);
    pSVar4 = pGen->pVm->pByteContainer;
    if (local_4c < pSVar4->nUsed) {
      lVar12 = (ulong)(local_4c * pSVar4->eSize) + (long)pSVar4->pBase;
    }
    if (lVar12 != 0) {
      *(sxu32 *)(lVar12 + 8) = pSVar4->nUsed;
    }
    if ((pNode->pRight != (jx9_expr_node *)0x0) &&
       (sVar9 = GenStateEmitExprCode(pGen,pNode->pRight,iFlags), sVar9 != 0)) {
      return sVar9;
    }
    if (local_50 == 0) {
      return 0;
    }
    pSVar4 = pGen->pVm->pByteContainer;
    if (local_50 < pSVar4->nUsed) {
      lVar12 = (ulong)(local_50 * pSVar4->eSize) + (long)pSVar4->pBase;
    }
    else {
      lVar12 = 0;
    }
    if (lVar12 == 0) {
      return 0;
    }
    *(sxu32 *)(lVar12 + 8) = pSVar4->nUsed;
    return 0;
  }
  local_48 = (SyToken *)(ulong)(uint)pjVar3->iVmOp;
  if (pNode->pLeft == (jx9_expr_node *)0x0) {
    sVar11 = 0;
    local_68 = 0;
  }
  else {
    if (pjVar3->iVmOp == 0x10) {
      sVar11 = (pNode->aNodeArgs).nUsed;
      bVar6 = 0 < (int)sVar11;
      if ((int)sVar11 < 1) {
LAB_00128ae6:
        local_68 = sVar11;
        uVar7 = iFlags & 0xfffffffd;
        sVar9 = unaff_R15D;
      }
      else {
        puVar5 = (undefined8 *)(pNode->aNodeArgs).pBase;
        sVar9 = GenStateEmitExprCode(pGen,(jx9_expr_node *)*puVar5,2);
        local_68 = 0;
        uVar7 = iFlags | 2;
        if (sVar9 == 0) {
          lVar12 = 1;
          do {
            sVar11 = (pNode->aNodeArgs).nUsed;
            bVar6 = lVar12 < (int)sVar11;
            if ((int)sVar11 <= lVar12) goto LAB_00128ae6;
            sVar9 = GenStateEmitExprCode(pGen,(jx9_expr_node *)puVar5[lVar12],2);
            lVar12 = lVar12 + 1;
          } while (sVar9 == 0);
        }
      }
      iFlags = uVar7;
      unaff_R15D = sVar9;
      if (bVar6) {
        return sVar9;
      }
    }
    else {
      local_68 = 0;
    }
    sVar9 = GenStateEmitExprCode(pGen,pNode->pLeft,iFlags);
    if (sVar9 != 0) {
      return sVar9;
    }
    if ((int)local_48 == 0x10) {
      pSVar4 = pGen->pVm->pByteContainer;
      if (pSVar4->nUsed == 0) {
        pcVar10 = (char *)0x0;
      }
      else {
        pcVar10 = (char *)((ulong)((pSVar4->nUsed - 1) * pSVar4->eSize) + (long)pSVar4->pBase);
      }
      if (pcVar10 != (char *)0x0) {
        if (*pcVar10 == '?') {
          pcVar10[8] = '\x01';
          pcVar10[9] = '\0';
          pcVar10[10] = '\0';
          pcVar10[0xb] = '\0';
        }
        else if (*pcVar10 == '\x04') {
          pcVar10[4] = '\0';
          pcVar10[5] = '\0';
          pcVar10[6] = '\0';
          pcVar10[7] = '\0';
        }
      }
LAB_00128bca:
      sVar11 = 0;
    }
    else if ((int)local_48 == 5) {
      sVar11 = (pNode->aNodeArgs).nUsed;
      bVar6 = 0 < (int)sVar11;
      if ((int)sVar11 < 1) {
LAB_00128d77:
        if (sVar11 != 0) {
          local_68 = 1;
        }
        sVar11 = iFlags & 1;
        sVar9 = unaff_R15D;
      }
      else {
        puVar5 = (undefined8 *)(pNode->aNodeArgs).pBase;
        sVar9 = GenStateEmitExprCode(pGen,(jx9_expr_node *)*puVar5,iFlags & 0xfffffffeU);
        sVar11 = 0;
        if (sVar9 == 0) {
          lVar12 = 1;
          do {
            sVar11 = (pNode->aNodeArgs).nUsed;
            bVar6 = lVar12 < (int)sVar11;
            if ((int)sVar11 <= lVar12) goto LAB_00128d77;
            sVar9 = GenStateEmitExprCode(pGen,(jx9_expr_node *)puVar5[lVar12],iFlags & 0xfffffffeU);
            lVar12 = lVar12 + 1;
          } while (sVar9 == 0);
          sVar11 = 0;
        }
      }
      if (bVar6) {
        return sVar9;
      }
    }
    else {
      sVar11 = 0;
      if (pNode->pOp->iOp == 0x33) {
        jx9VmEmitInstr(pGen->pVm,0xb,1,0,(void *)0x0,(sxu32 *)0x0);
        goto LAB_00128bca;
      }
    }
  }
  sVar9 = 0;
  local_54 = 0;
  iOp = (int)local_48;
  if (pNode->pRight == (jx9_expr_node *)0x0) {
    p3 = (void *)0x0;
    goto LAB_00128cab;
  }
  if (iOp == 0x28) {
    pVm = pGen->pVm;
    sVar9 = 10;
LAB_00128c1a:
    jx9VmEmitInstr(pVm,sVar9,1,0,(void *)0x0,&local_54);
  }
  else {
    if (iOp == 0x27) {
      pVm = pGen->pVm;
      sVar9 = 9;
      goto LAB_00128c1a;
    }
    iFlags = iFlags | (uint)(pNode->pOp->iPrec == 0x12);
  }
  sVar9 = GenStateEmitExprCode(pGen,pNode->pRight,iFlags);
  iVar8 = iOp;
  if (iOp == 0x2a) {
    pSVar4 = pGen->pVm->pByteContainer;
    sVar1 = pSVar4->nUsed;
    if (sVar1 == 0) {
      pcVar10 = (char *)0x0;
    }
    else {
      pcVar10 = (char *)((ulong)((sVar1 - 1) * pSVar4->eSize) + (long)pSVar4->pBase);
    }
    iOp = 0x2a;
    iVar8 = 0x2a;
    if (pcVar10 != (char *)0x0) {
      if (*pcVar10 == '?') {
        p3 = (void *)0x0;
        sVar11 = 1;
      }
      else {
        if (*pcVar10 == '\x05') {
          local_68 = *(sxu32 *)(pcVar10 + 4);
          iOp = 0x2b;
          p3 = (void *)0x0;
        }
        else {
          p3 = *(void **)(pcVar10 + 0x10);
          iOp = 0x2a;
        }
        if (sVar1 != 0) {
          pSVar4->nUsed = sVar1 - 1;
        }
      }
      goto LAB_00128cab;
    }
  }
  iOp = iVar8;
  p3 = (void *)0x0;
LAB_00128cab:
  if (0 < iOp) {
    if ((iOp - 0x31U < 2) && ((pNode->iFlags & 1) != 0)) {
      local_68 = 1;
    }
    jx9VmEmitInstr(pGen->pVm,iOp,local_68,sVar11,p3,(sxu32 *)0x0);
    if (local_54 != 0) {
      pSVar4 = pGen->pVm->pByteContainer;
      if (local_54 < pSVar4->nUsed) {
        lVar12 = (ulong)(local_54 * pSVar4->eSize) + (long)pSVar4->pBase;
      }
      else {
        lVar12 = 0;
      }
      if (lVar12 != 0) {
        *(sxu32 *)(lVar12 + 8) = pSVar4->nUsed;
      }
    }
  }
  return sVar9;
}

Assistant:

static sxi32 GenStateEmitExprCode(
	jx9_gen_state *pGen,  /* Code generator state */
	jx9_expr_node *pNode, /* Root of the expression tree */
	sxi32 iFlags /* Control flags */
	)
{
	VmInstr *pInstr;
	sxu32 nJmpIdx;
	sxi32 iP1 = 0;
	sxu32 iP2 = 0;
	void *p3  = 0;
	sxi32 iVmOp;
	sxi32 rc;
	if( pNode->xCode ){
		SyToken *pTmpIn, *pTmpEnd;
		/* Compile node */
		SWAP_DELIMITER(pGen, pNode->pStart, pNode->pEnd);
		rc = pNode->xCode(&(*pGen), iFlags);
		RE_SWAP_DELIMITER(pGen);
		return rc;
	}
	if( pNode->pOp == 0 ){
		jx9GenCompileError(&(*pGen), E_ERROR, pNode->pStart->nLine, 
			"Invalid expression node, JX9 is aborting compilation");
		return SXERR_ABORT;
	}
	iVmOp = pNode->pOp->iVmOp;
	if( pNode->pOp->iOp == EXPR_OP_QUESTY ){
		sxu32 nJz, nJmp;
		/* Ternary operator require special handling */
		/* Phase#1: Compile the condition */
		rc = GenStateEmitExprCode(&(*pGen), pNode->pCond, iFlags);
		if( rc != SXRET_OK ){
			return rc;
		}
		nJz = nJmp = 0; /* cc -O6 warning */
		/* Phase#2: Emit the false jump */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_JZ, 0, 0, 0, &nJz);
		if( pNode->pLeft ){
			/* Phase#3: Compile the 'then' expression  */
			rc = GenStateEmitExprCode(&(*pGen), pNode->pLeft, iFlags);
			if( rc != SXRET_OK ){
				return rc;
			}
		}
		/* Phase#4: Emit the unconditional jump */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_JMP, 0, 0, 0, &nJmp);
		/* Phase#5: Fix the false jump now the jump destination is resolved. */
		pInstr = jx9VmGetInstr(pGen->pVm, nJz);
		if( pInstr ){
			pInstr->iP2 = jx9VmInstrLength(pGen->pVm);
		}
		/* Phase#6: Compile the 'else' expression */
		if( pNode->pRight ){
			rc = GenStateEmitExprCode(&(*pGen), pNode->pRight, iFlags);
			if( rc != SXRET_OK ){
				return rc;
			}
		}
		if( nJmp > 0 ){
			/* Phase#7: Fix the unconditional jump */
			pInstr = jx9VmGetInstr(pGen->pVm, nJmp);
			if( pInstr ){
				pInstr->iP2 = jx9VmInstrLength(pGen->pVm);
			}
		}
		/* All done */
		return SXRET_OK;
	}
	/* Generate code for the left tree */
	if( pNode->pLeft ){
		if( iVmOp == JX9_OP_CALL ){
			jx9_expr_node **apNode;
			sxi32 n;
			/* Recurse and generate bytecodes for function arguments */
			apNode = (jx9_expr_node **)SySetBasePtr(&pNode->aNodeArgs);
			/* Read-only load */
			iFlags |= EXPR_FLAG_RDONLY_LOAD;
			for( n = 0 ; n < (sxi32)SySetUsed(&pNode->aNodeArgs) ; ++n ){
				rc = GenStateEmitExprCode(&(*pGen), apNode[n], iFlags&~EXPR_FLAG_LOAD_IDX_STORE);
				if( rc != SXRET_OK ){
					return rc;
				}
			}
			/* Total number of given arguments */
			iP1 = (sxi32)SySetUsed(&pNode->aNodeArgs);
			/* Remove stale flags now */
			iFlags &= ~EXPR_FLAG_RDONLY_LOAD;
		}
		rc = GenStateEmitExprCode(&(*pGen), pNode->pLeft, iFlags);
		if( rc != SXRET_OK ){
			return rc;
		}
		if( iVmOp == JX9_OP_CALL ){
			pInstr = jx9VmPeekInstr(pGen->pVm);
			if( pInstr ){
				if ( pInstr->iOp == JX9_OP_LOADC ){
					/* Prevent constant expansion */
					pInstr->iP1 = 0;
				}else if( pInstr->iOp == JX9_OP_MEMBER /* $a.b(1, 2, 3) */  ){
					/* Annonymous function call, flag that */
					pInstr->iP2 = 1;
				}
			}
		}else if( iVmOp == JX9_OP_LOAD_IDX ){
			jx9_expr_node **apNode;
			sxi32 n;
			/* Recurse and generate bytecodes for array index */
			apNode = (jx9_expr_node **)SySetBasePtr(&pNode->aNodeArgs);
			for( n = 0 ; n < (sxi32)SySetUsed(&pNode->aNodeArgs) ; ++n ){
				rc = GenStateEmitExprCode(&(*pGen), apNode[n], iFlags&~EXPR_FLAG_LOAD_IDX_STORE);
				if( rc != SXRET_OK ){
					return rc;
				}
			}
			if( SySetUsed(&pNode->aNodeArgs) > 0 ){
				iP1 = 1; /* Node have an index associated with it */
			}
			if( iFlags & EXPR_FLAG_LOAD_IDX_STORE ){
				/* Create an empty entry when the desired index is not found */
				iP2 = 1;
			}
		}else if( pNode->pOp->iOp == EXPR_OP_COMMA ){
			/* POP the left node */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_POP, 1, 0, 0, 0);
		}
	}
	rc = SXRET_OK;
	nJmpIdx = 0;
	/* Generate code for the right tree */
	if( pNode->pRight ){
		if( iVmOp == JX9_OP_LAND ){
			/* Emit the false jump so we can short-circuit the logical and */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_JZ, 1/* Keep the value on the stack */, 0, 0, &nJmpIdx);
		}else if (iVmOp == JX9_OP_LOR ){
			/* Emit the true jump so we can short-circuit the logical or*/
			jx9VmEmitInstr(pGen->pVm, JX9_OP_JNZ, 1/* Keep the value on the stack */, 0, 0, &nJmpIdx);
		}else if( pNode->pOp->iPrec == 18 /* Combined binary operators [i.e: =, '.=', '+=', *=' ...] precedence */ ){
			iFlags |= EXPR_FLAG_LOAD_IDX_STORE;
		}
		rc = GenStateEmitExprCode(&(*pGen), pNode->pRight, iFlags);
		if( iVmOp == JX9_OP_STORE ){
			pInstr = jx9VmPeekInstr(pGen->pVm);
			if( pInstr ){
				if(pInstr->iOp == JX9_OP_MEMBER ){
					/* Perform a member store operation [i.e: $this.x = 50] */
					iP2 = 1;
				}else{
					if( pInstr->iOp == JX9_OP_LOAD_IDX ){
						/* Transform the STORE instruction to STORE_IDX instruction */
						iVmOp = JX9_OP_STORE_IDX;
						iP1 = pInstr->iP1;
					}else{
						p3 = pInstr->p3;
					}
					/* POP the last dynamic load instruction */
					(void)jx9VmPopInstr(pGen->pVm);
				}
			}
		}
	}
	if( iVmOp > 0 ){
		if( iVmOp == JX9_OP_INCR || iVmOp == JX9_OP_DECR ){
			if( pNode->iFlags & EXPR_NODE_PRE_INCR ){
				/* Pre-increment/decrement operator [i.e: ++$i, --$j ] */
				iP1 = 1;
			}
		}
		/* Finally, emit the VM instruction associated with this operator */
		jx9VmEmitInstr(pGen->pVm, iVmOp, iP1, iP2, p3, 0);
		if( nJmpIdx > 0 ){
			/* Fix short-circuited jumps now the destination is resolved */
			pInstr = jx9VmGetInstr(pGen->pVm, nJmpIdx);
			if( pInstr ){
				pInstr->iP2 = jx9VmInstrLength(pGen->pVm);
			}
		}
	}
	return rc;
}